

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O3

Expression * __thiscall
slang::ast::CallExpression::createSystemCall
          (CallExpression *this,Compilation *compilation,SystemSubroutine *subroutine,
          Expression *firstArg,InvocationExpressionSyntax *syntax,
          ArrayOrRandomizeMethodExpressionSyntax *withClause,SourceRange range,ASTContext *context,
          Scope *randomizeScope)

{
  SyntaxKind *pSVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar4;
  PropertyExprSyntax *initialExpr;
  byte *pbVar5;
  undefined4 uVar7;
  pointer ppEVar6;
  uint uVar8;
  ushort uVar9;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  undefined1 auVar10 [16];
  char **ppcVar11;
  char cVar12;
  bool bVar13;
  int iVar14;
  Symbol *pSVar15;
  undefined4 extraout_var;
  SourceLocation SVar16;
  EmptyArgumentExpression *pEVar17;
  ExpressionSyntax *pEVar18;
  size_t sVar19;
  undefined4 extraout_var_00;
  Diagnostic *pDVar20;
  undefined4 extraout_var_01;
  Type *pTVar21;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar22;
  IteratorSymbol *pIVar23;
  undefined4 extraout_var_02;
  socklen_t __len;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX_03;
  ASTContext *argContext_00;
  Info *extraout_RDX_04;
  char *pcVar24;
  ulong uVar25;
  byte *pbVar26;
  SourceLocation SVar27;
  long lVar28;
  DiagCode code;
  DiagCode code_00;
  ulong hash;
  Info *pIVar29;
  CallExpression *unaff_R12;
  SyntaxNode *pSVar30;
  ulong uVar31;
  uint uVar32;
  undefined1 uVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  undefined1 auVar37 [16];
  SourceRange SVar38;
  undefined1 auVar39 [16];
  string_view arg;
  string_view arg_00;
  string_view indexMethodName;
  Token iteratorTok;
  anon_class_8_1_bc11688f getId;
  string_view iteratorName;
  SourceLocation iteratorLoc;
  ASTContext argContext;
  SmallVector<const_slang::ast::Expression_*,_5UL> buffer;
  SystemSubroutine *local_1d8;
  SystemSubroutine *local_1c8;
  Expression *local_1c0;
  RandomizeCallInfo local_1b8;
  undefined1 local_198 [32];
  IteratorSymbol *local_178;
  Info *pIStack_170;
  ParenExpressionListSyntax *local_168;
  value_type_pointer local_160;
  size_ctrl_type local_158;
  InvocationExpressionSyntax *local_148;
  string_view local_140;
  SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_> local_130;
  SourceLocation local_f8;
  ASTContext local_f0;
  SmallVectorBase<const_slang::ast::Expression_*> local_b8 [2];
  undefined1 local_78 [16];
  undefined1 local_68 [32];
  undefined1 local_48;
  byte bStack_47;
  byte bStack_46;
  byte bStack_45;
  undefined1 uStack_44;
  byte bStack_43;
  byte bStack_42;
  byte bStack_41;
  undefined1 uStack_40;
  byte bStack_3f;
  byte bStack_3e;
  byte bStack_3d;
  undefined1 uStack_3c;
  byte bStack_3b;
  byte bStack_3a;
  byte bStack_39;
  Type *args_1;
  
  local_78._8_8_ = *(undefined8 *)&(withClause->super_ExpressionSyntax).super_SyntaxNode;
  local_68._0_8_ = (Expression *)0x0;
  local_68._8_8_ = (ValueSymbol *)0x0;
  local_68._16_16_ = (undefined1  [16])0x0;
  local_b8[0].data_ = (pointer)local_b8[0].firstElement;
  local_b8[0].len = 0;
  local_b8[0].cap = 5;
  local_1c8 = subroutine;
  local_1c0 = firstArg;
  local_78._0_8_ = compilation;
  if (subroutine != (SystemSubroutine *)0x0) {
    SmallVectorBase<slang::ast::Expression_const*>::
    emplace_back<slang::ast::Expression_const*const&>
              ((SmallVectorBase<slang::ast::Expression_const*> *)local_b8,(Expression **)&local_1c8)
    ;
  }
  if ((compilation->options).maxRecursiveClassSpecialization == 1) {
    if (syntax == (InvocationExpressionSyntax *)0x0) {
      if (((local_1c0 != (Expression *)0x0) &&
          (SVar16 = local_1c0[1].sourceRange.endLoc, SVar16 != (SourceLocation)0x0)) &&
         (*(SyntaxNode **)((long)SVar16 + 0x58) != (SyntaxNode *)0x0)) {
        SVar38 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)SVar16);
        pDVar20 = ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0x680007,SVar38);
        Diagnostic::operator<<(pDVar20,(string *)&(compilation->super_BumpAllocator).endPtr);
        goto LAB_0041548b;
      }
    }
    else if (local_1c8 != (SystemSubroutine *)0x0) {
      pSVar30 = (syntax->attributes).super_SyntaxListBase.super_SyntaxNode.previewNode;
      if (pSVar30 != (SyntaxNode *)0x0) {
        SVar38 = slang::syntax::SyntaxNode::sourceRange(pSVar30);
        code.subsystem = Expressions;
        code.code = 0xa4;
LAB_0041547e:
        ASTContext::addDiag((ASTContext *)withClause,code,SVar38);
LAB_0041548b:
        local_1d8 = (SystemSubroutine *)0x0;
LAB_0041548d:
        unaff_R12 = (CallExpression *)
                    Expression::badExpr((Compilation *)this,(Expression *)local_1d8);
        goto LAB_0041549a;
      }
      pSVar30 = (syntax->attributes).super_SyntaxListBase.super_SyntaxNode.parent;
      if (pSVar30 == (SyntaxNode *)0x0) {
        SVar38 = parsing::Token::range((Token *)&syntax->attributes);
LAB_00415476:
        code.subsystem = Expressions;
        code.code = 0x52;
        goto LAB_0041547e;
      }
      if (((ulong)((long)&(pSVar30[3].previewNode)->kind + 1) & 0xfffffffffffffffe) != 2) {
        SVar38 = slang::syntax::SyntaxNode::sourceRange(pSVar30);
        goto LAB_00415476;
      }
      pbVar5 = (compilation->super_BumpAllocator).endPtr;
      uVar3 = (compilation->options).flags;
      uVar7 = (compilation->options).maxInstanceDepth;
      arg._M_len._4_4_ = uVar7;
      arg._M_len._0_4_ = uVar3;
      pTVar21 = (Type *)(local_1c8->name)._M_dataplus._M_p;
      local_f8 = (SourceLocation)0xffffffffffffffff;
      local_130.len = (long)"expected case item" + 0xe;
      local_130.data_ = (pointer)0x4;
      local_1b8.constraintRestrictions._M_ptr = (pointer)"index";
      local_1b8.inlineConstraints = (Constraint *)0x5;
      if (((local_1c0 != (Expression *)0x0) &&
          (SVar16 = local_1c0[1].sourceRange.endLoc, SVar16 != (SourceLocation)0x0)) &&
         (*(SyntaxNode **)((long)SVar16 + 0x58) != (SyntaxNode *)0x0)) {
        pbVar26 = (byte *)((long)&(*(SyntaxNode **)((long)SVar16 + 0x58))->kind + 1);
        if (pbVar26 < (byte *)0x6) {
          pSVar30 = *(SyntaxNode **)((long)SVar16 + 0x50);
          local_140._M_len = (size_t)withClause;
          ppSVar22 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                               ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *
                                )pSVar30);
          local_198._0_16_ =
               (undefined1  [16])
               getIteratorParams::anon_class_8_1_bc11688f::operator()
                         ((anon_class_8_1_bc11688f *)&local_140,(ArgumentSyntax *)*ppSVar22);
          if ((local_198._0_4_ >> 0x10 & 1) == 0 && local_198._8_8_ != (Info *)0x0) {
            if ((byte *)0x3 < pbVar26) {
              pSVar30 = pSVar30 + 2;
              ppSVar22 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                   ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     *)pSVar30);
              local_f0._0_16_ =
                   getIteratorParams::anon_class_8_1_bc11688f::operator()
                             ((anon_class_8_1_bc11688f *)&local_140,(ArgumentSyntax *)*ppSVar22);
              if (((uint)local_f0.scope.ptr >> 0x10 & 1) != 0 || local_f0._8_8_ == (Info *)0x0)
              goto LAB_0041548b;
              local_1b8._0_16_ = parsing::Token::valueText((Token *)&local_f0);
              iVar14 = *(int *)(**(long **)&(withClause->super_ExpressionSyntax).super_SyntaxNode +
                               0x48);
              if (iVar14 < 1) {
                ppSVar22 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                     ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                       *)pSVar30);
                SVar38 = slang::syntax::SyntaxNode::sourceRange(*ppSVar22);
                pDVar20 = ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0x20001,SVar38);
                pcVar24 = "";
                if (iVar14 == 0) {
                  pcVar24 = "1800-2017";
                }
                arg_00._M_str = pcVar24;
                arg_00._M_len = (ulong)(iVar14 == 0) * 9;
                Diagnostic::operator<<(pDVar20,arg_00);
              }
            }
            local_130._0_16_ = parsing::Token::valueText((Token *)local_198);
            local_f8 = parsing::Token::location((Token *)local_198);
            goto LAB_004156a2;
          }
        }
        else {
          SVar38 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)SVar16);
          pDVar20 = ASTContext::addDiag((ASTContext *)withClause,(DiagCode)0xa00007,SVar38);
          arg._M_str = (char *)pbVar5;
          Diagnostic::operator<<(pDVar20,arg);
          local_198._0_8_ = (Scope *)0x2;
          std::
          vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
          ::emplace_back<long>(&pDVar20->args,(long *)local_198);
          local_198._0_8_ = (ulong)pbVar26 >> 1;
          std::
          vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
          ::emplace_back<unsigned_long>(&pDVar20->args,(unsigned_long *)local_198);
        }
        goto LAB_0041548b;
      }
LAB_004156a2:
      pIVar23 = BumpAllocator::
                emplace<slang::ast::IteratorSymbol,slang::ast::Scope_const&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::Type_const&,std::basic_string_view<char,std::char_traits<char>>&>
                          ((BumpAllocator *)this,
                           *(Scope **)&(withClause->super_ExpressionSyntax).super_SyntaxNode,
                           (basic_string_view<char,_std::char_traits<char>_> *)&local_130,&local_f8,
                           pTVar21,(basic_string_view<char,_std::char_traits<char>_> *)&local_1b8);
      local_198._0_16_ =
           *(undefined1 (*) [16])&(withClause->super_ExpressionSyntax).super_SyntaxNode;
      pSVar30 = (withClause->super_ExpressionSyntax).super_SyntaxNode.previewNode;
      local_198._24_8_ = (withClause->method).ptr;
      pIStack_170 = (withClause->with).info;
      local_168 = withClause->args;
      (pIVar23->super_TempVarSymbol).nextTemp = *(TempVarSymbol **)&withClause->with;
      local_198._16_8_ = (ulong)pSVar30 & 0x1fffffffffbf;
      local_178 = pIVar23;
      ppSVar22 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            (syntax->attributes).super_SyntaxListBase.super_SyntaxNode.parent[3].
                            parent);
      iVar14 = Expression::bind((int)*ppSVar22,(sockaddr *)local_198,0);
      local_1d8 = (SystemSubroutine *)CONCAT44(extraout_var_02,iVar14);
      bVar13 = Expression::bad((Expression *)local_1d8);
      if (bVar13) goto LAB_0041548d;
      local_198._0_8_ = local_1d8;
      local_198._8_8_ = pIVar23;
      std::
      variant<std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
      ::operator=((variant<std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                   *)local_68,(IteratorCallInfo *)local_198);
      goto LAB_00415153;
    }
    local_1d8 = (SystemSubroutine *)0x0;
  }
  else {
    local_198._16_8_ = 0;
    local_198._24_8_ = (char *)0x0;
    local_198._0_2_ = Unknown;
    local_198[2] = 0;
    local_198[3] = '\0';
    local_198._4_4_ = 0;
    local_198._8_8_ = (Info *)0x0;
    local_178 = (IteratorSymbol *)0x3f;
    pIStack_170 = (Info *)0x1;
    local_160 = (value_type_pointer)0x0;
    local_168 = (ParenExpressionListSyntax *)
                &boost::unordered::detail::foa::
                 dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                 ::storage;
    local_158.ml = 0;
    local_158.size = 0;
    ASTContext::resetFlags(&local_f0,(ASTContext *)withClause,(bitmask<slang::ast::ASTFlags>)0x0);
    if ((compilation->options).maxRecursiveClassSpecialization == 2) {
      local_f0.randomizeDetails = (RandomizeDetails *)local_198;
      if (local_1c8 == (SystemSubroutine *)0x0) {
        if ((context != (ASTContext *)0x0) && (**(int **)&context->lookupIndex == 0x16)) {
          local_198._0_8_ = context;
        }
        goto LAB_00414c43;
      }
      unaff_R12 = (CallExpression *)(local_1c8->name)._M_dataplus._M_p;
      lVar28 = *(long *)((long)&(unaff_R12->subroutine).
                                super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                .
                                super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                .
                                super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                .
                                super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        + 0x10);
      if (lVar28 == 0) {
        Type::resolveCanonical((Type *)unaff_R12);
        lVar28 = *(long *)((long)&(unaff_R12->subroutine).
                                  super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                  .
                                  super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                  .
                                  super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                  .
                                  super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                          + 0x10);
      }
      local_198._0_8_ = lVar28 + 0x48;
      pSVar15 = Expression::getSymbolReference((Expression *)local_1c8,true);
      local_198._8_8_ = pSVar15;
      local_1d8 = local_1c8;
      src = extraout_RDX_00;
    }
    else {
LAB_00414c43:
      local_1d8 = (SystemSubroutine *)0x0;
      src = extraout_RDX;
    }
    if (syntax == (InvocationExpressionSyntax *)0x0) {
LAB_00414d99:
      local_148 = syntax;
      if (((local_1c0 != (Expression *)0x0) &&
          (SVar16 = local_1c0[1].sourceRange.endLoc, SVar16 != (SourceLocation)0x0)) &&
         (uVar25 = *(long *)((long)SVar16 + 0x58) + 1, 1 < uVar25)) {
        unaff_R12 = *(CallExpression **)((long)SVar16 + 0x50);
        uVar31 = 0;
        do {
          lVar28 = (uVar31 + 1) - (ulong)(local_1c8 == (SystemSubroutine *)0x0);
          ppSVar22 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                               ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *
                                )unaff_R12);
          if ((*ppSVar22)->kind == EmptyArgument) {
            cVar12 = (*(code *)(compilation->super_BumpAllocator).head[1].prev)(compilation,lVar28);
            if (cVar12 == '\0') {
              ppSVar22 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                   ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     *)unaff_R12);
              SVar38 = slang::syntax::SyntaxNode::sourceRange(*ppSVar22);
              code_00.subsystem = Expressions;
              code_00.code = 0x4d;
              goto LAB_004154fb;
            }
            pTVar21 = (Type *)this[2].thisClass_;
            ppSVar22 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                 ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   *)unaff_R12);
            local_130._0_16_ = slang::syntax::SyntaxNode::sourceRange(*ppSVar22);
            pEVar17 = BumpAllocator::
                      emplace<slang::ast::EmptyArgumentExpression,slang::ast::Type_const&,slang::SourceRange>
                                ((BumpAllocator *)this,pTVar21,(SourceRange *)&local_130);
            local_1b8.inlineConstraints = (Constraint *)pEVar17;
            SmallVectorBase<slang::ast::Expression_const*>::
            emplace_back<slang::ast::Expression_const*>
                      ((SmallVectorBase<slang::ast::Expression_const*> *)local_b8,
                       (Expression **)&local_1b8);
          }
          else {
            if ((*ppSVar22)->kind != OrderedArgument) {
              ppSVar22 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                   ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     *)unaff_R12);
              SVar38 = slang::syntax::SyntaxNode::sourceRange(*ppSVar22);
              code_00.subsystem = Expressions;
              code_00.code = 0x79;
LAB_004154fb:
              ASTContext::addDiag(&local_f0,code_00,SVar38);
              unaff_R12 = (CallExpression *)
                          Expression::badExpr((Compilation *)this,(Expression *)0x0);
              goto LAB_00415118;
            }
            ppSVar22 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                 ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   *)unaff_R12);
            pSVar4 = *ppSVar22;
            initialExpr = *(PropertyExprSyntax **)(pSVar4 + 1);
            if ((initialExpr->super_SyntaxNode).kind == ClockingPropertyExpr) {
              cVar12 = (*(code *)(compilation->super_BumpAllocator).head[1].current)
                                 (compilation,lVar28);
              if (cVar12 == '\0') {
                ppSVar22 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                     ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                       *)unaff_R12);
                SVar38 = slang::syntax::SyntaxNode::sourceRange(*ppSVar22);
                ASTContext::addDiag(&local_f0,(DiagCode)0x9e0007,SVar38);
                unaff_R12 = (CallExpression *)
                            Expression::badExpr((Compilation *)this,(Expression *)0x0);
                goto LAB_00415118;
              }
              SVar16 = (SourceLocation)
                       ClockingEventExpression::fromSyntax
                                 (*(ClockingEventExpression **)(pSVar4 + 1),
                                  (ClockingPropertyExprSyntax *)&local_f0,argContext_00);
              local_130.data_ = (pointer)SVar16;
              SmallVectorBase<slang::ast::Expression_const*>::
              emplace_back<slang::ast::Expression_const*>
                        ((SmallVectorBase<slang::ast::Expression_const*> *)local_b8,
                         (Expression **)&local_130);
            }
            else {
              pEVar18 = ASTContext::requireSimpleExpr((ASTContext *)withClause,initialExpr);
              if (pEVar18 == (ExpressionSyntax *)0x0) {
                unaff_R12 = (CallExpression *)
                            Expression::badExpr((Compilation *)this,(Expression *)0x0);
                goto LAB_00415118;
              }
              local_130.len = local_b8[0].len;
              local_130.data_ = (pointer)local_b8[0].data_;
              sVar19 = (*(code *)(compilation->super_BumpAllocator).head[2].current)
                                 (compilation,lVar28,(Token *)&local_f0,pEVar18,
                                  (string_view *)&local_130);
              local_1b8.inlineConstraints = (Constraint *)sVar19;
              SmallVectorBase<slang::ast::Expression_const*>::
              emplace_back<slang::ast::Expression_const*>
                        ((SmallVectorBase<slang::ast::Expression_const*> *)local_b8,
                         (Expression **)&local_1b8);
            }
          }
          uVar31 = uVar31 + 1;
          unaff_R12 = (CallExpression *)((long)unaff_R12 + 0x30);
        } while (uVar25 >> 1 != uVar31);
      }
      bVar13 = true;
      if (local_148 != (InvocationExpressionSyntax *)0x0) {
        if (((Scope *)local_198._0_8_ == (Scope *)0x0) &&
           ((SourceLocation)local_b8[0].len != (SourceLocation)0x0)) {
          SVar16 = (SourceLocation)((long)local_b8[0].data_ + local_b8[0].len * 8);
          SVar27 = (SourceLocation)local_b8[0].data_;
          do {
            pSVar15 = Expression::getSymbolReference(*(Expression **)SVar27,true);
            local_1b8.inlineConstraints = (Constraint *)pSVar15;
            if (pSVar15 != (Symbol *)0x0) {
              auVar39._8_8_ = 0;
              auVar39._0_8_ = pSVar15;
              hash = SUB168(auVar39 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                     SUB168(auVar39 * ZEXT816(0x9e3779b97f4a7c15),0);
              uVar31 = hash >> ((byte)local_178._0_1_ & 0x3f);
              uVar2 = (&boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::
                        match_word(unsigned_long)::word)[hash & 0xff];
              pIVar29 = (Info *)0x0;
              uVar25 = uVar31;
              do {
                pSVar1 = &(local_168->super_SyntaxNode).kind + uVar25 * 4;
                local_48 = (undefined1)*pSVar1;
                bStack_47 = *(byte *)((long)pSVar1 + 1);
                bStack_46 = *(byte *)((long)pSVar1 + 2);
                bStack_45 = *(byte *)((long)pSVar1 + 3);
                uStack_44 = *(undefined1 *)(pSVar1 + 1);
                bStack_43 = *(byte *)((long)pSVar1 + 5);
                bStack_42 = *(byte *)((long)pSVar1 + 6);
                bStack_41 = *(byte *)((long)pSVar1 + 7);
                uStack_40 = *(undefined1 *)(pSVar1 + 2);
                bStack_3f = *(byte *)((long)pSVar1 + 9);
                bStack_3e = *(byte *)((long)pSVar1 + 10);
                bStack_3d = *(byte *)((long)pSVar1 + 0xb);
                uStack_3c = *(undefined1 *)(pSVar1 + 3);
                bStack_3b = *(byte *)((long)pSVar1 + 0xd);
                bStack_3a = *(byte *)((long)pSVar1 + 0xe);
                bStack_39 = *(byte *)((long)pSVar1 + 0xf);
                uVar33 = (undefined1)uVar2;
                auVar37[0] = -(local_48 == uVar33);
                bVar34 = (byte)((uint)uVar2 >> 8);
                auVar37[1] = -(bStack_47 == bVar34);
                bVar35 = (byte)((uint)uVar2 >> 0x10);
                auVar37[2] = -(bStack_46 == bVar35);
                bVar36 = (byte)((uint)uVar2 >> 0x18);
                auVar37[3] = -(bStack_45 == bVar36);
                auVar37[4] = -(uStack_44 == uVar33);
                auVar37[5] = -(bStack_43 == bVar34);
                auVar37[6] = -(bStack_42 == bVar35);
                auVar37[7] = -(bStack_41 == bVar36);
                auVar37[8] = -(uStack_40 == uVar33);
                auVar37[9] = -(bStack_3f == bVar34);
                auVar37[10] = -(bStack_3e == bVar35);
                auVar37[0xb] = -(bStack_3d == bVar36);
                auVar37[0xc] = -(uStack_3c == uVar33);
                auVar37[0xd] = -(bStack_3b == bVar34);
                auVar37[0xe] = -(bStack_3a == bVar35);
                auVar37[0xf] = -(bStack_39 == bVar36);
                uVar9 = (ushort)(SUB161(auVar37 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe;
                if (uVar9 != 0) {
                  uVar32 = (uint)uVar9;
                  do {
                    uVar8 = 0;
                    if (uVar32 != 0) {
                      for (; (uVar32 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
                      }
                    }
                    if (pSVar15 == local_160[uVar25 * 0xf + (ulong)uVar8]) goto LAB_004153fc;
                    uVar32 = uVar32 - 1 & uVar32;
                  } while (uVar32 != 0);
                }
                if (((&boost::unordered::detail::foa::
                       group15<boost::unordered::detail::foa::plain_integral>::
                       is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_39) == 0)
                break;
                ppcVar11 = &pIVar29->rawTextPtr;
                pIVar29 = (Info *)((long)&pIVar29->rawTextPtr + 1);
                uVar25 = (long)ppcVar11 + uVar25 + 1 & (ulong)pIStack_170;
              } while (pIVar29 <= pIStack_170);
              if (local_158.size < local_158.ml) {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<slang::ast::Symbol_const*>>
                ::nosize_unchecked_emplace_at<slang::ast::Symbol_const*&>
                          ((locator *)&local_130,
                           (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<slang::ast::Symbol_const*>>
                            *)&local_178,(arrays_type *)&local_178,uVar31,hash,(Symbol **)&local_1b8
                          );
                local_158.size = local_158.size + 1;
              }
              else {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<slang::ast::Symbol_const*>>
                ::unchecked_emplace_with_rehash<slang::ast::Symbol_const*&>
                          ((locator *)&local_130,
                           (table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<slang::ast::Symbol_const*>>
                            *)&local_178,hash,(Symbol **)&local_1b8);
              }
            }
LAB_004153fc:
            SVar27 = (SourceLocation)((long)SVar27 + 8);
          } while (SVar27 != SVar16);
        }
        unaff_R12 = (CallExpression *)
                    std::
                    get<2ul,std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                              ((variant<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                                *)local_68);
        local_198._16_16_ = *(undefined1 (*) [16])&((Symbol *)&unaff_R12->super_Expression)->name;
        iVar14 = Constraint::bind((int)(local_148->attributes).super_SyntaxListBase.super_SyntaxNode
                                       .previewNode,(sockaddr *)&local_f0,__len);
        *(ulong *)&unaff_R12->super_Expression = CONCAT44(extraout_var_00,iVar14);
        bVar13 = true;
      }
    }
    else {
      if ((compilation->options).maxRecursiveClassSpecialization == 2) {
        if ((syntax->attributes).super_SyntaxListBase.super_SyntaxNode.previewNode !=
            (SyntaxNode *)0x0) {
          local_1b8.inlineConstraints = (Constraint *)0x0;
          local_1b8.constraintRestrictions._M_ptr = (pointer)0x0;
          local_1b8.constraintRestrictions._M_extent._M_extent_value = 0;
          unaff_R12 = (CallExpression *)
                      (syntax->attributes).super_SyntaxListBase.super_SyntaxNode.parent;
          if (unaff_R12 == (CallExpression *)0x0) {
LAB_00414d8c:
            std::
            variant<std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
            ::operator=((variant<std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                         *)local_68,&local_1b8);
            goto LAB_00414d99;
          }
          if ((local_f0.randomizeDetails != (RandomizeDetails *)0x0) &&
             ((local_f0.randomizeDetails)->classType != (Scope *)0x0)) {
            local_130.len = 0;
            local_130.data_ = (string_view *)local_130.firstElement;
            local_130.cap = 2;
            uVar25 = *(long *)((long)&(unaff_R12->subroutine).
                                      super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                      .
                                      super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                      .
                                      super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                      .
                                      super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                      .
                                      super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                      .
                                      super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                              + 0x28) + 1;
            if (1 < uVar25) {
              uVar25 = uVar25 >> 1;
              lVar28 = 0;
              do {
                ppSVar22 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                     ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                       *)(*(long *)((long)&(unaff_R12->subroutine).
                                                                                                                      
                                                  super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                                  .
                                                  super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                                  .
                                                  super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                                  .
                                                  super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                                  .
                                                  super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                                  .
                                                  super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                                  + 0x20) + lVar28));
                pSVar30 = *ppSVar22;
                if (pSVar30->kind == IdentifierName) {
                  local_140 = parsing::Token::valueText((Token *)(pSVar30 + 1));
                  SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>>::
                  emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                            ((SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *
                             )&local_130,&local_140);
                  src = extraout_RDX_01;
                }
                else {
                  SVar38 = slang::syntax::SyntaxNode::sourceRange(pSVar30);
                  ASTContext::addDiag(&local_f0,(DiagCode)0x410005,SVar38);
                  src = extraout_RDX_02;
                }
                lVar28 = lVar28 + 0x30;
                uVar25 = uVar25 - 1;
              } while (uVar25 != 0);
            }
            iVar14 = SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>::copy
                               (&local_130,(EVP_PKEY_CTX *)(local_f0.scope.ptr)->compilation,src);
            auVar39 = (undefined1  [16])local_1b8._0_16_;
            local_1b8.constraintRestrictions._M_ptr._4_4_ = extraout_var;
            local_1b8.constraintRestrictions._M_ptr._0_4_ = iVar14;
            local_1b8.inlineConstraints = auVar39._0_8_;
            local_1b8.constraintRestrictions._M_extent._M_extent_value = extraout_RDX_03;
            if (local_130.data_ != (string_view *)local_130.firstElement) {
              operator_delete(local_130.data_);
            }
            goto LAB_00414d8c;
          }
          SVar38 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)unaff_R12);
          ASTContext::addDiag(&local_f0,(DiagCode)0x780007,SVar38);
          unaff_R12 = (CallExpression *)Expression::badExpr((Compilation *)this,(Expression *)0x0);
          bVar13 = false;
          goto LAB_0041511b;
        }
        SVar38 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        ASTContext::addDiag(&local_f0,(DiagCode)0x6d0007,SVar38);
      }
      else {
        SVar38 = parsing::Token::range((Token *)&syntax->attributes);
        pDVar20 = ASTContext::addDiag(&local_f0,(DiagCode)0xad0007,SVar38);
        Diagnostic::operator<<(pDVar20,(string *)&(compilation->super_BumpAllocator).endPtr);
      }
      unaff_R12 = (CallExpression *)Expression::badExpr((Compilation *)this,(Expression *)0x0);
LAB_00415118:
      bVar13 = false;
    }
LAB_0041511b:
    if (local_160 != (value_type_pointer)0x0) {
      operator_delete(local_160,(long)pIStack_170 * 0x88 + 0x90);
    }
    if (!bVar13) goto LAB_0041549a;
  }
LAB_00415153:
  local_198._0_8_ = local_b8[0].data_;
  local_198._8_8_ = local_b8[0].len;
  auVar39 = (*(code *)(compilation->super_BumpAllocator).head[3].current)
                      (compilation,withClause,local_198,range.startLoc,range.endLoc,local_1d8);
  args_1 = auVar39._0_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_130.len;
  local_130._0_16_ = auVar10 << 0x40;
  local_198._0_4_ =
       SmallVectorBase<const_slang::ast::Expression_*>::copy
                 (local_b8,(EVP_PKEY_CTX *)this,auVar39._8_8_);
  local_198._4_4_ = extraout_var_01;
  SVar16 = (SourceLocation)local_198;
  local_198._8_8_ = extraout_RDX_04;
  local_f0._0_12_ = *(undefined1 (*) [12])&(withClause->super_ExpressionSyntax).super_SyntaxNode;
  unaff_R12 = BumpAllocator::
              emplace<slang::ast::CallExpression,slang::ast::CallExpression::SystemCallInfo&,slang::ast::Type_const&,decltype(nullptr),std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::LookupLocation,slang::SourceRange&>
                        ((BumpAllocator *)this,(SystemCallInfo *)local_78,args_1,(void **)&local_130
                         ,(span<const_slang::ast::Expression_*,_18446744073709551615UL> *)SVar16,
                         (LookupLocation *)&local_f0,&range);
  pTVar21 = args_1->canonical;
  if (pTVar21 == (Type *)0x0) {
    Type::resolveCanonical(args_1);
    pTVar21 = args_1->canonical;
  }
  if ((pTVar21->super_Symbol).kind == ErrorType) {
    unaff_R12 = (CallExpression *)
                Expression::badExpr((Compilation *)this,&unaff_R12->super_Expression);
  }
  else {
    sVar19 = (unaff_R12->arguments_)._M_extent._M_extent_value;
    if (sVar19 != 0) {
      ppEVar6 = (unaff_R12->arguments_)._M_ptr;
      lVar28 = 0;
      do {
        bVar13 = Expression::bad(*(Expression **)((long)ppEVar6 + lVar28));
        if (bVar13) {
          unaff_R12 = (CallExpression *)
                      Expression::badExpr((Compilation *)this,&unaff_R12->super_Expression);
          goto LAB_0041549a;
        }
        lVar28 = lVar28 + 8;
      } while (sVar19 << 3 != lVar28);
    }
    SVar38.endLoc = SVar16;
    SVar38.startLoc = range.endLoc;
    bVar13 = checkOutputArgs((ast *)withClause,
                             (ASTContext *)(ulong)(byte)(compilation->options).maxInstanceArray,
                             range.startLoc._0_1_,SVar38);
    if (bVar13) {
      if (local_1c0 != (Expression *)0x0) {
        syntax_00._M_ptr = (pointer)local_1c0[1].syntax;
        syntax_00._M_extent._M_extent_value = *(size_t *)&local_1c0[1].sourceRange.startLoc;
        ASTContext::setAttributes((ASTContext *)withClause,&unaff_R12->super_Expression,syntax_00);
      }
    }
    else {
      unaff_R12 = (CallExpression *)
                  Expression::badExpr((Compilation *)this,&unaff_R12->super_Expression);
    }
  }
LAB_0041549a:
  if (local_b8[0].data_ != (pointer)local_b8[0].firstElement) {
    operator_delete(local_b8[0].data_);
  }
  return &unaff_R12->super_Expression;
}

Assistant:

Expression& CallExpression::createSystemCall(
    Compilation& compilation, const SystemSubroutine& subroutine, const Expression* firstArg,
    const InvocationExpressionSyntax* syntax,
    const ArrayOrRandomizeMethodExpressionSyntax* withClause, SourceRange range,
    const ASTContext& context, const Scope* randomizeScope) {

    SystemCallInfo callInfo{&subroutine, context.scope, {}};
    SmallVector<const Expression*> buffer;
    if (firstArg)
        buffer.push_back(firstArg);

    const Expression* iterOrThis = nullptr;
    const ValueSymbol* iterVar = nullptr;
    using WithClauseMode = SystemSubroutine::WithClauseMode;
    if (subroutine.withClauseMode == WithClauseMode::Iterator) {
        // 'with' clause is not required. If it's not there, no arguments
        // can be provided.
        if (!withClause) {
            if (syntax && syntax->arguments && !syntax->arguments->parameters.empty()) {
                context.addDiag(diag::IteratorArgsWithoutWithClause,
                                syntax->arguments->sourceRange())
                    << subroutine.name;
                return badExpr(compilation, nullptr);
            }
        }
        else if (firstArg) {
            iterOrThis = bindIteratorExpr(compilation, subroutine.name, syntax, *withClause,
                                          *firstArg->type, context, iterVar);
            if (!iterOrThis || iterOrThis->bad())
                return badExpr(compilation, iterOrThis);

            callInfo.extraInfo = IteratorCallInfo{iterOrThis, iterVar};
        }
    }
    else {
        ASTContext::RandomizeDetails randomizeDetails;
        ASTContext argContext = context.resetFlags({});

        if (subroutine.withClauseMode == WithClauseMode::Randomize) {
            // If this is a class-scoped randomize call, setup the scope properly
            // so that class members can be found in the constraint block.
            argContext.randomizeDetails = &randomizeDetails;
            if (firstArg) {
                randomizeDetails.classType = &firstArg->type->getCanonicalType().as<ClassType>();
                randomizeDetails.thisVar = firstArg->getSymbolReference();
            }
            else if (randomizeScope && randomizeScope->asSymbol().kind == SymbolKind::ClassType) {
                randomizeDetails.classType = randomizeScope;
            }
            iterOrThis = firstArg;
        }

        if (withClause) {
            if (subroutine.withClauseMode == WithClauseMode::Randomize) {
                if (!withClause->constraints) {
                    argContext.addDiag(diag::MissingConstraintBlock, withClause->sourceRange());
                    return badExpr(compilation, nullptr);
                }

                RandomizeCallInfo randInfo;
                if (withClause->args) {
                    if (!argContext.randomizeDetails || !argContext.randomizeDetails->classType) {
                        argContext.addDiag(diag::NameListWithScopeRandomize,
                                           withClause->args->sourceRange());
                        return badExpr(compilation, nullptr);
                    }

                    SmallVector<std::string_view> names;
                    for (auto expr : withClause->args->expressions) {
                        if (expr->kind != SyntaxKind::IdentifierName) {
                            argContext.addDiag(diag::ExpectedIdentifier, expr->sourceRange());
                            continue;
                        }

                        names.push_back(expr->as<IdentifierNameSyntax>().identifier.valueText());
                    }

                    randInfo.constraintRestrictions = names.copy(argContext.getCompilation());
                }

                callInfo.extraInfo = randInfo;
            }
            else {
                argContext.addDiag(diag::WithClauseNotAllowed, withClause->with.range())
                    << subroutine.name;
                return badExpr(compilation, nullptr);
            }
        }

        // Bind arguments as we would for any ordinary method.
        if (syntax && syntax->arguments) {
            auto actualArgs = syntax->arguments->parameters;
            for (size_t i = 0; i < actualArgs.size(); i++) {
                size_t index = i + (firstArg ? 1 : 0);
                switch (actualArgs[i]->kind) {
                    case SyntaxKind::OrderedArgument: {
                        const auto& arg = actualArgs[i]->as<OrderedArgumentSyntax>();
                        if (arg.expr->kind == SyntaxKind::ClockingPropertyExpr) {
                            if (subroutine.allowClockingArgument(index)) {
                                buffer.push_back(&ClockingEventExpression::fromSyntax(
                                    arg.expr->as<ClockingPropertyExprSyntax>(), argContext));
                            }
                            else {
                                argContext.addDiag(diag::TimingControlNotAllowed,
                                                   actualArgs[i]->sourceRange());
                                return badExpr(compilation, nullptr);
                            }
                        }
                        else if (auto exSyn = context.requireSimpleExpr(*arg.expr)) {
                            buffer.push_back(
                                &subroutine.bindArgument(index, argContext, *exSyn, buffer));
                        }
                        else {
                            return badExpr(compilation, nullptr);
                        }
                        break;
                    }
                    case SyntaxKind::NamedArgument:
                        argContext.addDiag(diag::NamedArgNotAllowed, actualArgs[i]->sourceRange());
                        return badExpr(compilation, nullptr);
                    case SyntaxKind::EmptyArgument:
                        if (subroutine.allowEmptyArgument(index)) {
                            buffer.push_back(compilation.emplace<EmptyArgumentExpression>(
                                compilation.getVoidType(), actualArgs[i]->sourceRange()));
                        }
                        else {
                            argContext.addDiag(diag::EmptyArgNotAllowed,
                                               actualArgs[i]->sourceRange());
                            return badExpr(compilation, nullptr);
                        }
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
            }
        }

        if (withClause) {
            // Finally bind the inline constraint block if we have one.
            SLANG_ASSERT(withClause->constraints);

            // For scope randomize calls we need to register the
            // arg variables so they get treated as 'rand'.
            if (!randomizeDetails.classType) {
                for (auto arg : buffer) {
                    auto sym = arg->getSymbolReference();
                    if (sym)
                        randomizeDetails.scopeRandVars.emplace(sym);
                }
            }

            auto& randInfo = std::get<2>(callInfo.extraInfo);
            randomizeDetails.nameRestrictions = randInfo.constraintRestrictions;
            randInfo.inlineConstraints = &Constraint::bind(*withClause->constraints, argContext);
        }
    }

    const Type& type = subroutine.checkArguments(context, buffer, range, iterOrThis);
    auto expr = compilation.emplace<CallExpression>(callInfo, type, nullptr,
                                                    buffer.copy(compilation), context.getLocation(),
                                                    range);

    if (type.isError())
        return badExpr(compilation, expr);

    for (auto arg : expr->arguments()) {
        if (arg->bad())
            return badExpr(compilation, expr);
    }

    if (!checkOutputArgs(context, subroutine.hasOutputArgs, range))
        return badExpr(compilation, expr);

    if (syntax)
        context.setAttributes(*expr, syntax->attributes);

    return *expr;
}